

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O1

wchar_t artifact_power(wchar_t a_idx,char *reason,_Bool verbose)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  object *known_obj;
  char buf [256];
  object *local_128;
  object *local_120;
  char local_118 [256];
  
  local_128 = object_new();
  local_120 = object_new();
  wVar2 = L'\0';
  file_putf(log_file,"********** Evaluating %s ********\n",reason);
  file_putf(log_file,"Artifact index is %d\n",a_idx);
  _Var1 = make_fake_artifact(local_128,a_info + a_idx);
  if (_Var1) {
    object_copy(local_120,local_128);
    local_128->known = local_120;
    object_desc(local_118,0x100,local_128,99,(player *)0x0);
    file_putf(log_file,"%s\n",local_118);
    wVar2 = object_power(local_128,true,log_file);
  }
  object_delete((chunk *)0x0,(chunk *)0x0,&local_120);
  object_delete((chunk *)0x0,(chunk *)0x0,&local_128);
  return wVar2;
}

Assistant:

static int artifact_power(int a_idx, const char *reason, bool verbose)
{
	struct object *obj = object_new();
	struct object *known_obj = object_new();
	char buf[256];
	int32_t power;

	file_putf(log_file, "********** Evaluating %s ********\n", reason);
	file_putf(log_file, "Artifact index is %d\n", a_idx);

	if (!make_fake_artifact(obj, &a_info[a_idx])) {
		object_delete(NULL, NULL, &known_obj);
		object_delete(NULL, NULL, &obj);
		return 0;
	}

	object_copy(known_obj, obj);
	obj->known = known_obj;
	object_desc(buf, 256 * sizeof(char), obj,
		ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, NULL);
	file_putf(log_file, "%s\n", buf);

	power = object_power(obj, verbose, log_file);

	object_delete(NULL, NULL, &known_obj);
	object_delete(NULL, NULL, &obj);
	return power;
}